

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O1

bool __thiscall
iDynTree::optimalcontrol::OptimalControlProblem::constraintsJacobianWRTControl
          (OptimalControlProblem *this,double time,VectorDynSize *state,VectorDynSize *control,
          MatrixDynSize *jacobian)

{
  variable_if_dynamic<long,__1> vVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  PointerType pdVar7;
  ostream *poVar8;
  _Rb_tree_node_base *p_Var9;
  bool bVar10;
  DstEvaluatorType dstEvaluator;
  SrcEvaluatorType srcEvaluator;
  ostringstream errorMsg;
  assign_op<double,_double> local_231;
  undefined1 local_230 [16];
  DstEvaluatorType local_220;
  long local_208;
  undefined8 local_200;
  long local_1f8;
  _Rb_tree_node_base *local_1f0;
  double local_1e8;
  VectorDynSize *local_1e0;
  DstEvaluatorType local_1d8;
  SrcEvaluatorType local_1c0;
  PointerType local_1a8;
  ulong local_1a0;
  undefined8 local_198;
  long local_190;
  undefined8 local_188;
  long local_180;
  long local_170;
  undefined8 local_168;
  long local_160;
  ios_base local_138 [264];
  
  local_1e8 = time;
  local_1e0 = state;
  uVar3 = getConstraintsDimension(this);
  uVar4 = iDynTree::MatrixDynSize::rows();
  if (uVar4 == uVar3) {
    lVar5 = iDynTree::MatrixDynSize::cols();
    lVar6 = iDynTree::VectorDynSize::size();
    if (lVar5 == lVar6) goto LAB_00148bba;
  }
  iDynTree::VectorDynSize::size();
  iDynTree::MatrixDynSize::resize((ulong)jacobian,(ulong)uVar3);
LAB_00148bba:
  local_1f8 = iDynTree::MatrixDynSize::data();
  local_200 = iDynTree::MatrixDynSize::rows();
  local_208 = iDynTree::MatrixDynSize::cols();
  p_Var9 = (this->m_pimpl->constraintsGroups)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1f0 = &(this->m_pimpl->constraintsGroups)._M_t._M_impl.super__Rb_tree_header._M_header;
  bVar10 = p_Var9 == local_1f0;
  if (!bVar10) {
    local_220.
    super_block_evaluator<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
    .
    super_mapbase_evaluator<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
    .m_outerStride.m_value = 0;
    do {
      bVar2 = ConstraintsGroup::constraintJacobianWRTControl
                        ((ConstraintsGroup *)**(undefined8 **)(p_Var9 + 2),local_1e8,local_1e0,
                         control,(MatrixDynSize *)(*(undefined8 **)(p_Var9 + 2) + 0xb));
      if (bVar2) {
        pdVar7 = (PointerType)iDynTree::MatrixDynSize::data();
        iDynTree::MatrixDynSize::rows();
        lVar5 = iDynTree::MatrixDynSize::cols();
        uVar3 = ConstraintsGroup::constraintsDimension
                          ((ConstraintsGroup *)**(undefined8 **)(p_Var9 + 2));
        local_198 = iDynTree::VectorDynSize::size();
        vVar1.m_value =
             local_220.
             super_block_evaluator<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
             .
             super_mapbase_evaluator<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
             .m_outerStride.m_value;
        local_1a0 = (ulong)uVar3;
        local_1d8.
        super_block_evaluator<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
        .
        super_mapbase_evaluator<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
        .m_data = (PointerType)
                  (local_1f8 +
                  local_220.
                  super_block_evaluator<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
                  .
                  super_mapbase_evaluator<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                  .m_outerStride.m_value * local_208 * 8);
        local_190 = local_1f8;
        local_188 = local_200;
        local_180 = local_208;
        local_170 = local_220.
                    super_block_evaluator<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
                    .
                    super_mapbase_evaluator<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                    .m_outerStride.m_value;
        local_168 = 0;
        local_160 = local_208;
        local_1d8.
        super_block_evaluator<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
        .
        super_mapbase_evaluator<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
        .m_outerStride.m_value = local_208;
        local_230._0_8_ = &local_1d8;
        local_230._8_8_ = &local_1c0;
        local_220.
        super_block_evaluator<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
        .
        super_mapbase_evaluator<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
        .m_data = (PointerType)&local_231;
        local_220.
        super_block_evaluator<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
        .
        super_mapbase_evaluator<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
        ._8_8_ = (ostringstream *)&local_1a8;
        local_1c0.
        super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
        .m_data = pdVar7;
        local_1c0.
        super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
        .m_outerStride.m_value = lVar5;
        local_1a8 = local_1d8.
                    super_block_evaluator<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
                    .
                    super_mapbase_evaluator<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                    .m_data;
        Eigen::internal::
        dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
        ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
               *)local_230);
        lVar5 = iDynTree::MatrixDynSize::rows();
        local_220.
        super_block_evaluator<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
        .
        super_mapbase_evaluator<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
        .m_outerStride.m_value = vVar1.m_value + lVar5;
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"Error while evaluating constraint ",0x22);
        ConstraintsGroup::name_abi_cxx11_
                  ((string *)local_230,(ConstraintsGroup *)**(undefined8 **)(p_Var9 + 2));
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_1a8,(char *)local_230._0_8_,local_230._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,".",1);
        if ((DstEvaluatorType *)local_230._0_8_ != &local_220) {
          operator_delete((void *)local_230._0_8_,
                          (ulong)((long)local_220.
                                        super_block_evaluator<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
                                        .
                                        super_mapbase_evaluator<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                        .m_data + 1));
        }
        std::__cxx11::stringbuf::str();
        iDynTree::reportError
                  ("OptimalControlProblem","constraintsJacobianWRTControl",(char *)local_230._0_8_);
        if ((DstEvaluatorType *)local_230._0_8_ != &local_220) {
          operator_delete((void *)local_230._0_8_,
                          (ulong)((long)local_220.
                                        super_block_evaluator<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
                                        .
                                        super_mapbase_evaluator<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                        .m_data + 1));
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
      }
      if (!bVar2) {
        return bVar10;
      }
      p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
      bVar10 = p_Var9 == local_1f0;
    } while (!bVar10);
  }
  return bVar10;
}

Assistant:

bool OptimalControlProblem::constraintsJacobianWRTControl(double time, const VectorDynSize &state, const VectorDynSize &control, MatrixDynSize &jacobian)
        {
            unsigned int nc = getConstraintsDimension();
            if ((jacobian.rows() != nc) || (jacobian.cols() != control.size())) {
                jacobian.resize(nc, control.size());
            }

            iDynTreeEigenMatrixMap jacobianMap = toEigen(jacobian);
            Eigen::Index offset = 0;

            for (auto& group : m_pimpl->constraintsGroups){
                if (! group.second->group_ptr->constraintJacobianWRTControl(time, state, control, group.second->controlJacobianBuffer)){
                    std::ostringstream errorMsg;
                    errorMsg << "Error while evaluating constraint " << group.second->group_ptr->name() <<".";
                    reportError("OptimalControlProblem", "constraintsJacobianWRTControl", errorMsg.str().c_str());
                    return false;
                }
                jacobianMap.block(offset, 0, group.second->group_ptr->constraintsDimension(), control.size()) = toEigen(group.second->controlJacobianBuffer);
                offset += group.second->controlJacobianBuffer.rows();
            }
            return true;
        }